

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::MSA::get_track_at_position(MSA *this,Address address)

{
  uint8_t *source;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  long lVar2;
  int iVar4;
  shared_ptr<Storage::Disk::Track> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  iVar4 = (int)in_RDX;
  _Var3._M_pi = in_RDX;
  if (iVar4 < (int)(uint)*(ushort *)((long)address + 0xf2)) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (ulong)*(ushort *)((long)address + 0xf4);
    iVar1 = (int)((long)in_RDX >> 0x22);
    if (((int)(uint)*(ushort *)((long)address + 0xf4) <= iVar1) &&
       (iVar1 <= (int)(uint)*(ushort *)((long)address + 0xf6))) {
      lVar2 = ((long)iVar1 - (long)_Var3._M_pi) * (ulong)*(ushort *)((long)address + 0xf2) * 0x18 +
              *(long *)((long)address + 0xf8);
      source = *(uint8_t **)(lVar2 + (long)iVar4 * 0x18);
      if (source == *(uint8_t **)(lVar2 + 8 + (long)iVar4 * 0x18)) {
        __assert_fail("!track.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                      ,0x56,
                      "virtual std::shared_ptr< ::Storage::Disk::Track> Storage::Disk::MSA::get_track_at_position(::Storage::Disk::Track::Address)"
                     );
      }
      sVar5 = track_for_sectors((Disk *)this,source,(uint)*(ushort *)((long)address + 0xf0),
                                (uint8_t)iVar1,(uint8_t)in_RDX,'\x01','\x02',Double);
      _Var3 = sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      goto LAB_0043ae02;
    }
  }
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
  (this->file_).file_ = (FILE *)0x0;
LAB_0043ae02:
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> MSA::get_track_at_position(::Storage::Disk::Track::Address address) {
	if(address.head >= sides_) return nullptr;

	const auto position = address.position.as_int();
	if(position < starting_track_) return nullptr;
	if(position > ending_track_) return nullptr;

	const auto &track = uncompressed_tracks_[size_t(position - starting_track_) * size_t(sides_) + size_t(address.head)];
	assert(!track.empty());
	return track_for_sectors(track.data(), sectors_per_track_, uint8_t(position), uint8_t(address.head), 1, 2, Storage::Encodings::MFM::Density::Double);
}